

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O3

int make_streamsInfo(archive_write *a,uint64_t offset,uint64_t pack_size,uint64_t unpack_size,
                    int num_coder,coder *coders,int substrm,uint32_t header_crc)

{
  void *pvVar1;
  coder *coders_00;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ssize_t sVar7;
  undefined4 in_register_00000084;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint8_t crc [4];
  char local_4c [5];
  undefined1 local_47;
  undefined1 local_46;
  undefined1 local_45;
  int local_44;
  uint64_t local_40;
  int local_34;
  
  local_44 = (int)coders;
  coders_00 = (coder *)CONCAT44(in_register_00000084,num_coder);
  pvVar1 = a->format_data;
  iVar5 = 1;
  if (*(int *)CONCAT44(in_register_00000084,num_coder) == 0) {
    iVar5 = *(int *)((long)pvVar1 + 0x20);
  }
  local_40 = unpack_size;
  uVar2 = enc_uint64(a,6);
  if ((-1 < (int)uVar2) && (uVar2 = enc_uint64(a,offset), -1 < (int)uVar2)) {
    uVar2 = enc_uint64(a,(long)iVar5);
    if ((-1 < (int)uVar2) && (uVar2 = enc_uint64(a,9), -1 < (int)uVar2)) {
      if (iVar5 < 2) {
        iVar3 = enc_uint64(a,pack_size);
        if (iVar3 < 0) {
          return iVar3;
        }
      }
      else {
        for (lVar10 = *(long *)((long)pvVar1 + 0xf110);
            (lVar10 != 0 && (*(uint64_t *)(lVar10 + 0x30) != 0)); lVar10 = *(long *)(lVar10 + 0x18))
        {
          iVar3 = enc_uint64(a,*(uint64_t *)(lVar10 + 0x30));
          if (iVar3 < 0) {
            return iVar3;
          }
        }
      }
      uVar2 = enc_uint64(a,0);
      if ((((-1 < (int)uVar2) && (uVar2 = enc_uint64(a,7), -1 < (int)uVar2)) &&
          (uVar2 = enc_uint64(a,0xb), -1 < (int)uVar2)) &&
         ((uVar2 = enc_uint64(a,(long)iVar5), -1 < (int)uVar2 &&
          (uVar2 = enc_uint64(a,0), -1 < (int)uVar2)))) {
        if (0 < iVar5) {
          iVar3 = 0;
          do {
            iVar4 = enc_uint64(a,1);
            if (iVar4 < 0) {
              return iVar4;
            }
            uVar2 = coders_00->codec;
            local_4c[0] = '\0';
            local_4c[1] = '\0';
            local_4c[2] = '\0';
            local_4c[3] = '\0';
            local_4c[4] = (char)(uVar2 >> 0x18);
            local_47 = (char)(uVar2 >> 0x10);
            local_46 = (char)(uVar2 >> 8);
            local_45 = (char)uVar2;
            uVar9 = 9;
            pcVar6 = local_4c;
            do {
              if (*pcVar6 != '\0') {
                iVar4 = (int)uVar9 + -1;
                goto LAB_001afe64;
              }
              uVar9 = uVar9 - 1;
              pcVar6 = pcVar6 + 1;
            } while (1 < uVar9);
            iVar4 = 0;
LAB_001afe64:
            uVar8 = iVar4 + (uint)(iVar4 == 0);
            uVar2 = uVar8 | 0x20;
            if (coders_00->prop_size == 0) {
              uVar2 = uVar8;
            }
            iVar4 = enc_uint64(a,(long)(int)uVar2);
            if (iVar4 < 0) {
              return iVar4;
            }
            sVar7 = compress_out(a,local_4c + (int)(8 - (uVar8 & 0xf)),(ulong)(uVar8 & 0xf),
                                 ARCHIVE_Z_RUN);
            if ((int)sVar7 < 0) {
              return (int)sVar7;
            }
            if (coders_00->prop_size != 0) {
              iVar4 = enc_uint64(a,coders_00->prop_size);
              if (iVar4 < 0) {
                return iVar4;
              }
              sVar7 = compress_out(a,coders_00->props,coders_00->prop_size,ARCHIVE_Z_RUN);
              if ((int)sVar7 < 0) {
                return (int)sVar7;
              }
            }
            iVar3 = iVar3 + 1;
          } while (iVar3 != iVar5);
        }
        uVar2 = enc_uint64(a,0xc);
        if (-1 < (int)uVar2) {
          if (iVar5 < 2) {
            iVar5 = enc_uint64(a,local_40);
            if (iVar5 < 0) {
              return iVar5;
            }
          }
          else {
            for (lVar10 = *(long *)((long)pvVar1 + 0xf110);
                (lVar10 != 0 && (*(uint64_t *)(lVar10 + 0x30) != 0));
                lVar10 = *(long *)(lVar10 + 0x18)) {
              iVar5 = enc_uint64(a,*(uint64_t *)(lVar10 + 0x30));
              if (iVar5 < 0) {
                return iVar5;
              }
            }
          }
          if (local_44 == 0) {
            iVar5 = enc_uint64(a,10);
            if (iVar5 < 0) {
              return iVar5;
            }
            iVar5 = enc_uint64(a,1);
            if (iVar5 < 0) {
              return iVar5;
            }
            local_34 = substrm;
            sVar7 = compress_out(a,&local_34,4,ARCHIVE_Z_RUN);
            if ((int)sVar7 < 0) {
              return (int)sVar7;
            }
            uVar2 = enc_uint64(a,0);
          }
          else {
            iVar5 = enc_uint64(a,0);
            if (iVar5 < 0) {
              return iVar5;
            }
            uVar2 = make_substreamsInfo(a,coders_00);
          }
          if (-1 < (int)uVar2) {
            uVar2 = enc_uint64(a,0);
            uVar2 = (int)uVar2 >> 0x1f & uVar2;
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

static int
make_streamsInfo(struct archive_write *a, uint64_t offset, uint64_t pack_size,
    uint64_t unpack_size, int num_coder, struct coder *coders, int substrm,
    uint32_t header_crc)
{
	struct _7zip *zip = (struct _7zip *)a->format_data;
	uint8_t codec_buff[8];
	int numFolders, fi;
	int codec_size;
	int i, r;

	if (coders->codec == _7Z_COPY)
		numFolders = (int)zip->total_number_nonempty_entry;
	else
		numFolders = 1;

	/*
	 * Make PackInfo.
	 */
	r = enc_uint64(a, kPackInfo);
	if (r < 0)
		return (r);

	/* Write PackPos. */
	r = enc_uint64(a, offset);
	if (r < 0)
		return (r);

	/* Write NumPackStreams. */
	r = enc_uint64(a, numFolders);
	if (r < 0)
		return (r);

	/* Make Size. */
	r = enc_uint64(a, kSize);
	if (r < 0)
		return (r);

	if (numFolders > 1) {
		struct file *file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->size == 0)
				break;
			r = enc_uint64(a, file->size);
			if (r < 0)
				return (r);
		}
	} else {
		/* Write size. */
		r = enc_uint64(a, pack_size);
		if (r < 0)
			return (r);
	}

	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	/*
	 * Make UnPackInfo.
	 */
	r = enc_uint64(a, kUnPackInfo);
	if (r < 0)
		return (r);

	/*
	 * Make Folder.
	 */
	r = enc_uint64(a, kFolder);
	if (r < 0)
		return (r);

	/* Write NumFolders. */
	r = enc_uint64(a, numFolders);
	if (r < 0)
		return (r);

	/* Write External. */
	r = enc_uint64(a, 0);
	if (r < 0)
		return (r);

	for (fi = 0; fi < numFolders; fi++) {
		/* Write NumCoders. */
		r = enc_uint64(a, num_coder);
		if (r < 0)
			return (r);

		for (i = 0; i < num_coder; i++) {
			unsigned codec_id = coders[i].codec;

			/* Write Codec flag. */
			archive_be64enc(codec_buff, codec_id);
			for (codec_size = 8; codec_size > 0; codec_size--) {
				if (codec_buff[8 - codec_size])
					break;
			}
			if (codec_size == 0)
				codec_size = 1;
			if (coders[i].prop_size)
				r = enc_uint64(a, codec_size | 0x20);
			else
				r = enc_uint64(a, codec_size);
			if (r < 0)
				return (r);

			/* Write Codec ID. */
			codec_size &= 0x0f;
			r = (int)compress_out(a, &codec_buff[8-codec_size],
				codec_size, ARCHIVE_Z_RUN);
			if (r < 0)
				return (r);

			if (coders[i].prop_size) {
				/* Write Codec property size. */
				r = enc_uint64(a, coders[i].prop_size);
				if (r < 0)
					return (r);

				/* Write Codec properties. */
				r = (int)compress_out(a, coders[i].props,
					coders[i].prop_size, ARCHIVE_Z_RUN);
				if (r < 0)
					return (r);
			}
		}
	}

	/*
	 * Make CodersUnPackSize.
	 */
	r = enc_uint64(a, kCodersUnPackSize);
	if (r < 0)
		return (r);

	if (numFolders > 1) {
		struct file *file = zip->file_list.first;
		for (;file != NULL; file = file->next) {
			if (file->size == 0)
				break;
			r = enc_uint64(a, file->size);
			if (r < 0)
				return (r);
		}

	} else {
		/* Write UnPackSize. */
		r = enc_uint64(a, unpack_size);
		if (r < 0)
			return (r);
	}

	if (!substrm) {
		uint8_t crc[4];
		/*
		 * Make CRC.
		 */
		r = enc_uint64(a, kCRC);
		if (r < 0)
			return (r);

		/* All are defined */
		r = enc_uint64(a, 1);
		if (r < 0)
			return (r);
		archive_le32enc(crc, header_crc);
		r = (int)compress_out(a, crc, 4, ARCHIVE_Z_RUN);
		if (r < 0)
			return (r);
	}

	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	if (substrm) {
		/*
		 * Make SubStreamsInfo.
		 */
		r = make_substreamsInfo(a, coders);
		if (r < 0)
			return (r);
	}


	/* Write End. */
	r = enc_uint64(a, kEnd);
	if (r < 0)
		return (r);

	return (ARCHIVE_OK);
}